

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorKeyReference::DescriptorKeyReference
          (DescriptorKeyReference *this,ExtPrivkey *ext_privkey,string *arg)

{
  SchnorrPubkey local_b8;
  byte local_9e;
  allocator local_9d [13];
  ExtPubkey local_90;
  string *local_20;
  string *arg_local;
  ExtPrivkey *ext_privkey_local;
  DescriptorKeyReference *this_local;
  
  this->key_type_ = kDescriptorKeyBip32Priv;
  local_20 = arg;
  arg_local = (string *)ext_privkey;
  ext_privkey_local = (ExtPrivkey *)this;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  ExtPrivkey::GetExtPubkey(&local_90,(ExtPrivkey *)arg_local);
  ExtPubkey::GetPubkey(&this->pubkey_,&local_90);
  ExtPubkey::~ExtPubkey(&local_90);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_,(ExtPrivkey *)arg_local);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  KeyData::KeyData(&this->key_data_);
  local_9e = 0;
  if (local_20 == (string *)0x0) {
    ::std::allocator<char>::allocator();
    local_9e = 1;
    ::std::__cxx11::string::string((string *)&this->argument_,"",local_9d);
  }
  else {
    ::std::__cxx11::string::string((string *)&this->argument_,(string *)local_20);
  }
  if ((local_9e & 1) != 0) {
    ::std::allocator<char>::~allocator((allocator<char> *)local_9d);
  }
  SchnorrPubkey::FromPubkey(&local_b8,&this->pubkey_,(bool *)0x0);
  SchnorrPubkey::operator=(&this->schnorr_pubkey_,&local_b8);
  SchnorrPubkey::~SchnorrPubkey(&local_b8);
  return;
}

Assistant:

DescriptorKeyReference::DescriptorKeyReference(
    const ExtPrivkey& ext_privkey, const std::string* arg)
    : key_type_(DescriptorKeyType::kDescriptorKeyBip32Priv),
      pubkey_(ext_privkey.GetExtPubkey().GetPubkey()),
      extprivkey_(ext_privkey),
      argument_((arg) ? *arg : "") {
  schnorr_pubkey_ = SchnorrPubkey::FromPubkey(pubkey_);
}